

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

string * __thiscall
Assimp::ColladaLoader::FindNameForNode_abi_cxx11_
          (string *__return_storage_ptr__,ColladaLoader *this,Node *pNode)

{
  ostringstream local_190 [376];
  
  if (this->useColladaName == true) {
    if ((pNode->mName)._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"$ColladaAutoName$_");
      this->mNodeNameCounter = this->mNodeNameCounter + 1;
      std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      std::__cxx11::stringbuf::str();
LAB_00386505:
      std::__cxx11::ostringstream::~ostringstream(local_190);
      return __return_storage_ptr__;
    }
  }
  else if ((pNode->mID)._M_string_length == 0) {
    if ((pNode->mSID)._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::operator<<((ostream *)local_190,"$ColladaAutoName$_");
      this->mNodeNameCounter = this->mNodeNameCounter + 1;
      std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      std::__cxx11::stringbuf::str();
      goto LAB_00386505;
    }
    pNode = (Node *)&pNode->mSID;
  }
  else {
    pNode = (Node *)&pNode->mID;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pNode);
  return __return_storage_ptr__;
}

Assistant:

std::string ColladaLoader::FindNameForNode(const Collada::Node* pNode)
{
    // If explicitly requested, just use the collada name.
    if (useColladaName)
    {
        if (!pNode->mName.empty()) {
            return pNode->mName;
        }
        else {
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
    else
    {
        // Now setup the name of the assimp node. The collada name might not be
        // unique, so we use the collada ID.
        if (!pNode->mID.empty())
            return pNode->mID;
        else if (!pNode->mSID.empty())
            return pNode->mSID;
        else
        {
            // No need to worry. Unnamed nodes are no problem at all, except
            // if cameras or lights need to be assigned to them.
            return format() << "$ColladaAutoName$_" << mNodeNameCounter++;
        }
    }
}